

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::GridAxisIrregular
          (GridAxisIrregular *this,KFLOAT64 InitialXi,KFLOAT64 FinalXi,KUINT16 PointsXi,
          KUINT8 InterleafFactor,KUINT8 AxisType,KUINT16 InitialIndexXi,KFLOAT64 CoordinateScaleXi,
          KFLOAT64 CoordinateOffsetXi,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *XiValues)

{
  GridAxisRegular::GridAxisRegular
            (&this->super_GridAxisRegular,InitialXi,FinalXi,PointsXi,InterleafFactor,AxisType,
             (KUINT16)((uint)(*(int *)&(XiValues->
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                             *(int *)&(XiValues->
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 1),
             InitialIndexXi);
  (this->super_GridAxisRegular).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridAxisIrregular_00226b38;
  this->m_f64CoordScaleXi = CoordinateScaleXi;
  this->m_f64CoordOffsetXi = CoordinateOffsetXi;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vXiValues,XiValues);
  (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  calculatePadding(this);
  return;
}

Assistant:

GridAxisIrregular::GridAxisIrregular( KFLOAT64 InitialXi, KFLOAT64 FinalXi, KUINT16 PointsXi, KUINT8 InterleafFactor,
                                      KUINT8 AxisType, KUINT16 InitialIndexXi, KFLOAT64 CoordinateScaleXi,
                                      KFLOAT64 CoordinateOffsetXi, const vector<KUINT16> & XiValues ) :
    GridAxisRegular( InitialXi, FinalXi, PointsXi, InterleafFactor, AxisType, XiValues.size(), InitialIndexXi ),
    m_f64CoordScaleXi( CoordinateScaleXi ),
    m_f64CoordOffsetXi( CoordinateOffsetXi ),
    m_vXiValues( XiValues )
{
    calculatePadding();
}